

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_info(stbi__context *s,int *x,int *y,int *comp)

{
  int *y_00;
  stbi__jpeg *in_RCX;
  undefined8 in_RDI;
  stbi__jpeg *j;
  int result;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  y_00 = (int *)stbi__malloc(0x4fb792);
  if (y_00 == (int *)0x0) {
    local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    *(undefined8 *)y_00 = in_RDI;
    local_4 = stbi__jpeg_info_raw(in_RCX,(int *)CONCAT44(in_stack_ffffffffffffffd4,
                                                         in_stack_ffffffffffffffd0),y_00,
                                  (int *)0x4fb7d3);
    free(y_00);
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_info(stbi__context *s, int *x, int *y, int *comp)
{
   int result;
   stbi__jpeg* j = (stbi__jpeg*) (stbi__malloc(sizeof(stbi__jpeg)));
   if (!j) return stbi__err("outofmem", "Out of memory");
   j->s = s;
   result = stbi__jpeg_info_raw(j, x, y, comp);
   STBI_FREE(j);
   return result;
}